

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O1

void __thiscall
AllReduceSockets::pass_down
          (AllReduceSockets *this,char *buffer,size_t parent_read_pos,size_t *children_sent_pos)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  size_t __n;
  
  sVar2 = *children_sent_pos;
  __n = parent_read_pos - sVar2;
  if (0xffff < __n) {
    __n = 0x10000;
  }
  if (parent_read_pos != sVar2) {
    iVar1 = (this->socks).children[0];
    if (iVar1 != -1) {
      sVar3 = send(iVar1,buffer + sVar2,__n,0);
      if (sVar3 < (long)__n) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Write to left child failed\n",0x1b);
      }
    }
    iVar1 = (this->socks).children[1];
    if (iVar1 != -1) {
      sVar3 = send(iVar1,buffer + *children_sent_pos,__n,0);
      if (sVar3 < (long)__n) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Write to right child failed\n",0x1c);
      }
    }
    *children_sent_pos = *children_sent_pos + __n;
  }
  return;
}

Assistant:

void AllReduceSockets::pass_down(char* buffer, const size_t parent_read_pos, size_t& children_sent_pos)
{
  size_t my_bufsize = min(ar_buf_size, (parent_read_pos - children_sent_pos));

  if (my_bufsize > 0)
  {
    // going to pass up this chunk of data to the children
    if (socks.children[0] != -1 &&
        send(socks.children[0], buffer + children_sent_pos, (int)my_bufsize, 0) < (int)my_bufsize)
      cerr << "Write to left child failed\n";
    if (socks.children[1] != -1 &&
        send(socks.children[1], buffer + children_sent_pos, (int)my_bufsize, 0) < (int)my_bufsize)
      cerr << "Write to right child failed\n";

    children_sent_pos += my_bufsize;
  }
}